

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

int Ivy_NodeHasZeroSim(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj)

{
  long lVar1;
  
  if (0 < (long)p->nSimWords) {
    lVar1 = 0;
    do {
      if (*(int *)((long)&pObj->pFanout->pFanout + lVar1 * 4) != 0) {
        return 0;
      }
      lVar1 = lVar1 + 1;
    } while (p->nSimWords != lVar1);
  }
  return 1;
}

Assistant:

int Ivy_NodeHasZeroSim( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj )
{
    Ivy_FraigSim_t * pSims;
    int i;
    pSims = Ivy_ObjSim(pObj);
    for ( i = 0; i < p->nSimWords; i++ )
        if ( pSims->pData[i] )
            return 0;
    return 1;
}